

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::~QXmlStreamReaderPrivate(QXmlStreamReaderPrivate *this)

{
  QXmlStreamPrivateTagStack *in_RDI;
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration> *unaff_retaddr;
  
  free((void *)in_RDI[9].tagStack.cap);
  free((((__uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *)
        &in_RDI[10].namespaceDeclarations.data)->_M_t).
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl);
  std::unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>::
  ~unique_ptr((unique_ptr<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_> *)
              in_RDI);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute>::~QXmlStreamSimpleStack
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::Attribute> *)unaff_retaddr);
  QString::~QString((QString *)0x648c27);
  QList<QXmlStreamEntityDeclaration>::~QList((QList<QXmlStreamEntityDeclaration> *)0x648c38);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::~QXmlStreamSimpleStack
            (unaff_retaddr);
  QList<QXmlStreamNamespaceDeclaration>::~QList((QList<QXmlStreamNamespaceDeclaration> *)0x648c5a);
  QList<QXmlStreamNotationDeclaration>::~QList((QList<QXmlStreamNotationDeclaration> *)0x648c6b);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::~QXmlStreamSimpleStack
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration> *)unaff_retaddr);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute>::~QXmlStreamSimpleStack
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::DtdAttribute> *)in_RDI);
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x648c9e);
  QString::~QString((QString *)0x648caf);
  QString::~QString((QString *)0x648cc0);
  QStringDecoder::~QStringDecoder((QStringDecoder *)0x648cd1);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference>::~QXmlStreamSimpleStack
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::QEntityReference> *)unaff_retaddr);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_RDI);
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::~QHash
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)in_RDI);
  QXmlStreamSimpleStack<unsigned_int>::~QXmlStreamSimpleStack
            ((QXmlStreamSimpleStack<unsigned_int> *)in_RDI);
  QString::~QString((QString *)0x648d26);
  QByteArray::~QByteArray((QByteArray *)0x648d37);
  QByteArray::~QByteArray((QByteArray *)0x648d45);
  QXmlStreamPrivateTagStack::~QXmlStreamPrivateTagStack(in_RDI);
  return;
}

Assistant:

QXmlStreamReaderPrivate::~QXmlStreamReaderPrivate()
{
    free(sym_stack);
    free(state_stack);
}